

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScenePreprocessor.cpp
# Opt level: O0

void __thiscall Assimp::ScenePreprocessor::ProcessScene(ScenePreprocessor *this)

{
  aiMaterial **ppaVar1;
  aiMaterial *this_00;
  Logger *this_01;
  uint local_444;
  undefined1 local_440 [4];
  uint i_2;
  aiColor3D clr;
  undefined1 local_424 [8];
  aiString name;
  aiMaterial *helper;
  uint i_1;
  uint i;
  ScenePreprocessor *this_local;
  
  if (this->scene != (aiScene *)0x0) {
    for (helper._4_4_ = 0; helper._4_4_ < this->scene->mNumMeshes; helper._4_4_ = helper._4_4_ + 1)
    {
      ProcessMesh(this,this->scene->mMeshes[helper._4_4_]);
    }
    for (helper._0_4_ = 0; (uint)helper < this->scene->mNumAnimations;
        helper._0_4_ = (uint)helper + 1) {
      ProcessAnimation(this,this->scene->mAnimations[(uint)helper]);
    }
    if ((this->scene->mNumMaterials == 0) && (this->scene->mNumMeshes != 0)) {
      ppaVar1 = (aiMaterial **)operator_new__(0x10);
      this->scene->mMaterials = ppaVar1;
      aiString::aiString((aiString *)local_424);
      this_00 = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(this_00);
      this->scene->mMaterials[this->scene->mNumMaterials] = this_00;
      name.data._1016_8_ = this_00;
      aiColor3D::aiColor3D((aiColor3D *)local_440,0.6,0.6,0.6);
      aiMaterial::AddProperty
                ((aiMaterial *)name.data._1016_8_,(aiColor3D *)local_440,1,"$clr.diffuse",0,0);
      aiString::Set((aiString *)local_424,"DefaultMaterial");
      aiMaterial::AddProperty
                ((aiMaterial *)name.data._1016_8_,(aiString *)local_424,"?mat.name",0,0);
      this_01 = DefaultLogger::get();
      Logger::debug(this_01,"ScenePreprocessor: Adding default material \'DefaultMaterial\'");
      for (local_444 = 0; local_444 < this->scene->mNumMeshes; local_444 = local_444 + 1) {
        this->scene->mMeshes[local_444]->mMaterialIndex = this->scene->mNumMaterials;
      }
      this->scene->mNumMaterials = this->scene->mNumMaterials + 1;
    }
    return;
  }
  __assert_fail("scene != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/ScenePreprocessor.cpp"
                ,0x36,"void Assimp::ScenePreprocessor::ProcessScene()");
}

Assistant:

void ScenePreprocessor::ProcessScene ()
{
    ai_assert(scene != NULL);

    // Process all meshes
    for (unsigned int i = 0; i < scene->mNumMeshes;++i)
        ProcessMesh(scene->mMeshes[i]);

    // - nothing to do for nodes for the moment
    // - nothing to do for textures for the moment
    // - nothing to do for lights for the moment
    // - nothing to do for cameras for the moment

    // Process all animations
    for (unsigned int i = 0; i < scene->mNumAnimations;++i)
        ProcessAnimation(scene->mAnimations[i]);

    // Generate a default material if none was specified
    if (!scene->mNumMaterials && scene->mNumMeshes) {
        scene->mMaterials      = new aiMaterial*[2];
        aiMaterial* helper;

        aiString name;

        scene->mMaterials[scene->mNumMaterials] = helper = new aiMaterial();
        aiColor3D clr(0.6f,0.6f,0.6f);
        helper->AddProperty(&clr,1,AI_MATKEY_COLOR_DIFFUSE);

        // setup the default name to make this material identifiable
        name.Set(AI_DEFAULT_MATERIAL_NAME);
        helper->AddProperty(&name,AI_MATKEY_NAME);

        ASSIMP_LOG_DEBUG("ScenePreprocessor: Adding default material \'" AI_DEFAULT_MATERIAL_NAME  "\'");

        for (unsigned int i = 0; i < scene->mNumMeshes;++i) {
            scene->mMeshes[i]->mMaterialIndex = scene->mNumMaterials;
        }

        scene->mNumMaterials++;
    }
}